

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O2

_Bool find_empty_range(chunk_conflict *c,loc_conflict *grid,loc_conflict top_left,
                      loc_conflict bottom_right)

{
  _Bool _Var1;
  
  _Var1 = cave_find_in_range(c,grid,top_left,bottom_right,square_isempty);
  return _Var1;
}

Assistant:

bool find_empty_range(struct chunk *c, struct loc *grid, struct loc top_left,
	struct loc bottom_right)
{
	return cave_find_in_range(c, grid, top_left, bottom_right,
		square_isempty);
}